

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockNode.cpp
# Opt level: O0

void __thiscall LockNode::LockNode(LockNode *this,Instruction *instruction,CallInst *callInst)

{
  undefined8 in_RDX;
  Node *in_RSI;
  Instruction *in_RDI;
  CallInst *in_stack_ffffffffffffffd8;
  
  Node::Node(in_RSI,(NodeType)((ulong)in_RDX >> 0x20),in_RDI,in_stack_ffffffffffffffd8);
  *(undefined ***)in_RDI = &PTR__LockNode_001cdb38;
  std::set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_>::set
            ((set<UnlockNode_*,_std::less<UnlockNode_*>,_std::allocator<UnlockNode_*>_> *)0x18fb80);
  return;
}

Assistant:

LockNode::LockNode(const llvm::Instruction *instruction,
                   const llvm::CallInst *callInst)
        : Node(NodeType::LOCK, instruction, callInst) {}